

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

void __thiscall
Assimp::LWOImporter::GenerateNodeGraph
          (LWOImporter *this,
          map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
          *apcNodes)

{
  _Rb_tree_header *p_Var1;
  undefined1 *__s;
  _Base_ptr *pp_Var2;
  uint uVar3;
  SharedPostProcessInfo *__n;
  mapped_type paVar4;
  aiNode **ppaVar5;
  LWOImporter *pLVar6;
  aiNode *paVar7;
  aiNode *paVar8;
  size_t sVar9;
  long *plVar10;
  _Base_ptr p_Var11;
  mapped_type *ppaVar12;
  aiNode *paVar13;
  _Rb_tree_node_base *p_Var14;
  _Rb_tree_node_base *p_Var15;
  _Base_ptr p_Var16;
  runtime_error *this_00;
  long *plVar17;
  _Rb_tree_header *p_Var18;
  ulong uVar19;
  bool bVar20;
  uint16_t parentIndex;
  MakeLeftHandedProcess maker;
  FlipWindingOrderProcess flipper;
  map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  mapPivot;
  undefined2 local_ba;
  MakeLeftHandedProcess local_b8;
  long lStack_a0;
  FlipWindingOrderProcess local_98;
  LWOImporter *local_78;
  aiNode *local_70;
  _Base_ptr local_68;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_aiNode_*>,_std::_Select1st<std::pair<const_unsigned_short,_aiNode_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  local_60;
  
  paVar7 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar7);
  this->pScene->mRootNode = paVar7;
  (paVar7->mName).length = 9;
  builtin_strncpy((paVar7->mName).data,"<LWORoot>",10);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(apcNodes->_M_t)._M_impl.super__Rb_tree_header;
  p_Var14 = (apcNodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  local_78 = this;
  paVar13 = paVar7;
  paVar8 = local_70;
  while (local_70 = paVar13, (_Rb_tree_header *)p_Var14 != p_Var1) {
    local_68 = p_Var14[1]._M_parent[0x22]._M_parent;
    local_ba = (undefined2)local_68[9]._M_color;
    paVar8 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar8);
    p_Var16 = p_Var14[1]._M_parent;
    __s = &p_Var16->field_0x4;
    local_98.super_BaseProcess._vptr_BaseProcess =
         (_func_int **)&local_98.super_BaseProcess.progress;
    sVar9 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,__s,&p_Var16->field_0x4 + sVar9);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x6b6a3c);
    local_b8.super_BaseProcess._vptr_BaseProcess =
         (_func_int **)&local_b8.super_BaseProcess.progress;
    plVar17 = plVar10 + 2;
    if ((ProgressHandler **)*plVar10 == (ProgressHandler **)plVar17) {
      local_b8.super_BaseProcess.progress = (ProgressHandler *)*plVar17;
      lStack_a0 = plVar10[3];
    }
    else {
      local_b8.super_BaseProcess.progress = (ProgressHandler *)*plVar17;
      local_b8.super_BaseProcess._vptr_BaseProcess = (_func_int **)*plVar10;
    }
    __n = (SharedPostProcessInfo *)plVar10[1];
    *plVar10 = (long)plVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    local_b8.super_BaseProcess.shared = __n;
    if (__n < (SharedPostProcessInfo *)0x400) {
      (paVar8->mName).length = (ai_uint32)__n;
      memcpy((paVar8->mName).data,local_b8.super_BaseProcess._vptr_BaseProcess,(size_t)__n);
      (paVar8->mName).data[(long)__n] = '\0';
    }
    if ((ProgressHandler **)local_b8.super_BaseProcess._vptr_BaseProcess !=
        &local_b8.super_BaseProcess.progress) {
      operator_delete(local_b8.super_BaseProcess._vptr_BaseProcess,
                      (ulong)((long)&(local_b8.super_BaseProcess.progress)->_vptr_ProgressHandler +
                             1));
    }
    paVar7 = local_70;
    if ((ProgressHandler **)local_98.super_BaseProcess._vptr_BaseProcess !=
        &local_98.super_BaseProcess.progress) {
      operator_delete(local_98.super_BaseProcess._vptr_BaseProcess,
                      (ulong)((long)&(local_98.super_BaseProcess.progress)->_vptr_ProgressHandler +
                             1));
    }
    p_Var14[1]._M_parent[0x22]._M_parent = (_Base_ptr)paVar8;
    p_Var16 = (apcNodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var11 = &p_Var1->_M_header;
    for (; (_Rb_tree_header *)p_Var16 != (_Rb_tree_header *)0x0;
        p_Var16 = (&p_Var16->_M_left)[bVar20]) {
      bVar20 = (ushort)(short)*(size_t *)(p_Var16 + 1) < (ushort)local_ba;
      if (!bVar20) {
        p_Var11 = p_Var16;
      }
    }
    p_Var18 = p_Var1;
    if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
       (p_Var18 = (_Rb_tree_header *)p_Var11,
       (ushort)local_ba < (ushort)(short)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
      p_Var18 = p_Var1;
    }
    paVar13 = paVar7;
    if (p_Var18 != p_Var1) {
      ppaVar12 = std::
                 map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                 ::operator[](apcNodes,&local_ba);
      paVar13 = *ppaVar12;
    }
    paVar8->mParent = paVar13;
    *(uint *)&p_Var14[1]._M_parent[0x20]._M_left = *(uint *)&local_68[10]._M_parent ^ 0x80000000;
    p_Var14[1]._M_parent[0x21]._M_color =
         *(_Rb_tree_color *)((long)&local_68[10]._M_parent + 4) ^ 0x80000000;
    *(uint *)&p_Var14[1]._M_parent[0x21]._M_left = *(uint *)&local_68[10]._M_left ^ 0x80000000;
    (paVar8->mTransformation).a4 = *(float *)&local_68[10]._M_parent;
    (paVar8->mTransformation).b4 = *(float *)((long)&local_68[10]._M_parent + 4);
    (paVar8->mTransformation).c4 = *(float *)&local_68[10]._M_left;
    local_b8.super_BaseProcess._vptr_BaseProcess =
         (_func_int **)
         CONCAT62(local_b8.super_BaseProcess._vptr_BaseProcess._2_6_,-2 - (short)p_Var14[1]._M_color
                 );
    ppaVar12 = std::
               map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
               ::operator[]((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                             *)&local_60,(key_type_conflict1 *)&local_b8);
    *ppaVar12 = paVar8;
    p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    paVar13 = local_70;
    paVar8 = local_70;
  }
  local_70 = paVar8;
  for (p_Var14 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var14 != &local_60._M_impl.super__Rb_tree_header;
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
    paVar4 = (mapped_type)p_Var14[1]._M_parent;
    ppaVar12 = std::
               map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
               ::operator[](apcNodes,(key_type_conflict1 *)(p_Var14 + 1));
    *ppaVar12 = paVar4;
  }
  local_b8.super_BaseProcess._vptr_BaseProcess._2_6_ =
       (undefined6)((ulong)local_b8.super_BaseProcess._vptr_BaseProcess >> 0x10);
  local_b8.super_BaseProcess._vptr_BaseProcess =
       (_func_int **)CONCAT62(local_b8.super_BaseProcess._vptr_BaseProcess._2_6_,0xffff);
  ppaVar12 = std::
             map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
             ::operator[](apcNodes,(key_type_conflict1 *)&local_b8);
  *ppaVar12 = paVar7;
  p_Var14 = (apcNodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  pLVar6 = local_78;
  while (local_78 = pLVar6, (_Rb_tree_header *)p_Var14 != p_Var1) {
    for (p_Var15 = (apcNodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var15 != p_Var1;
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
      if (((short)p_Var14[1]._M_color != (short)p_Var15[1]._M_color) &&
         (p_Var14[1]._M_parent == p_Var15[1]._M_parent[0x22]._M_parent)) {
        pp_Var2 = &p_Var14[1]._M_parent[0x22]._M_left;
        *(int *)pp_Var2 = *(int *)pp_Var2 + 1;
      }
    }
    uVar19 = (ulong)*(uint *)&p_Var14[1]._M_parent[0x22]._M_left;
    if (uVar19 != 0) {
      p_Var16 = (_Base_ptr)operator_new__(uVar19 << 3);
      p_Var14[1]._M_parent[0x22]._M_right = p_Var16;
      p_Var15 = (apcNodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var15 != p_Var1) {
        uVar19 = 0;
        do {
          if ((short)p_Var14[1]._M_color != (short)p_Var15[1]._M_color) {
            if (p_Var14[1]._M_parent == p_Var15[1]._M_parent[0x22]._M_parent) {
              *(_Base_ptr *)
               (&(p_Var14[1]._M_parent[0x22]._M_right)->_M_color + (uVar19 & 0xffff) * 2) =
                   p_Var15[1]._M_parent;
              uVar19 = (ulong)((int)uVar19 + 1);
            }
          }
          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
        } while ((_Rb_tree_header *)p_Var15 != p_Var1);
      }
    }
    p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    pLVar6 = local_78;
  }
  paVar7 = pLVar6->pScene->mRootNode;
  uVar3 = paVar7->mNumChildren;
  if (uVar3 == 1) {
    ppaVar5 = paVar7->mChildren;
    paVar7 = *ppaVar5;
    *ppaVar5 = (aiNode *)0x0;
    paVar7->mParent = (aiNode *)0x0;
    paVar8 = pLVar6->pScene->mRootNode;
    if (paVar8 != (aiNode *)0x0) {
      aiNode::~aiNode(paVar8);
      operator_delete(paVar8,0x478);
    }
    pLVar6->pScene->mRootNode = paVar7;
  }
  else if (uVar3 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_b8.super_BaseProcess._vptr_BaseProcess =
         (_func_int **)&local_b8.super_BaseProcess.progress;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"LWO: Unable to build a valid node graph","");
    std::runtime_error::runtime_error(this_00,(string *)&local_b8);
    *(undefined ***)this_00 = &PTR__runtime_error_007fa260;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  MakeLeftHandedProcess::MakeLeftHandedProcess(&local_b8);
  MakeLeftHandedProcess::Execute(&local_b8,pLVar6->pScene);
  FlipWindingOrderProcess::FlipWindingOrderProcess(&local_98);
  FlipWindingOrderProcess::Execute(&local_98,pLVar6->pScene);
  FlipWindingOrderProcess::~FlipWindingOrderProcess(&local_98);
  MakeLeftHandedProcess::~MakeLeftHandedProcess(&local_b8);
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_aiNode_*>,_std::_Select1st<std::pair<const_unsigned_short,_aiNode_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void LWOImporter::GenerateNodeGraph(std::map<uint16_t,aiNode*>& apcNodes)
{
    // now generate the final nodegraph - generate a root node and attach children
    aiNode* root = pScene->mRootNode = new aiNode();
    root->mName.Set("<LWORoot>");

    //Set parent of all children, inserting pivots
    //std::cout << "Set parent of all children" << std::endl;
    std::map<uint16_t, aiNode*> mapPivot;
    for (auto itapcNodes = apcNodes.begin(); itapcNodes != apcNodes.end(); ++itapcNodes) {

        //Get the parent index
        LWO::Layer* nodeLayer = (LWO::Layer*)(itapcNodes->second->mParent);
        uint16_t parentIndex = nodeLayer->mParent;

        //Create pivot node, store it into the pivot map, and set the parent as the pivot
        aiNode* pivotNode = new aiNode();
        pivotNode->mName.Set("Pivot-"+std::string(itapcNodes->second->mName.data));
        itapcNodes->second->mParent = pivotNode;

        //Look for the parent node to attach the pivot to
        if (apcNodes.find(parentIndex) != apcNodes.end()) {
            pivotNode->mParent = apcNodes[parentIndex];
        } else {
            //If not, attach to the root node
            pivotNode->mParent = root;
        }

        //Set the node and the pivot node transformation
        itapcNodes->second->mTransformation.a4 = -nodeLayer->mPivot.x;
        itapcNodes->second->mTransformation.b4 = -nodeLayer->mPivot.y;
        itapcNodes->second->mTransformation.c4 = -nodeLayer->mPivot.z;
        pivotNode->mTransformation.a4 = nodeLayer->mPivot.x;
        pivotNode->mTransformation.b4 = nodeLayer->mPivot.y;
        pivotNode->mTransformation.c4 = nodeLayer->mPivot.z;
        mapPivot[-(itapcNodes->first+2)] = pivotNode;
    }

    //Merge pivot map into node map
    //std::cout << "Merge pivot map into node map" << std::endl;
    for (auto itMapPivot = mapPivot.begin(); itMapPivot != mapPivot.end(); ++itMapPivot) {
        apcNodes[itMapPivot->first] = itMapPivot->second;
    }

    //Set children of all parents
    apcNodes[-1] = root;
    for (auto itMapParentNodes = apcNodes.begin(); itMapParentNodes != apcNodes.end(); ++itMapParentNodes) {
        for (auto itMapChildNodes = apcNodes.begin(); itMapChildNodes != apcNodes.end(); ++itMapChildNodes) {
            if ((itMapParentNodes->first != itMapChildNodes->first) && (itMapParentNodes->second == itMapChildNodes->second->mParent)) {
                ++(itMapParentNodes->second->mNumChildren);
            }
        }
        if (itMapParentNodes->second->mNumChildren) {
            itMapParentNodes->second->mChildren = new aiNode* [ itMapParentNodes->second->mNumChildren ];
            uint16_t p = 0;
            for (auto itMapChildNodes = apcNodes.begin(); itMapChildNodes != apcNodes.end(); ++itMapChildNodes) {
                if ((itMapParentNodes->first != itMapChildNodes->first) && (itMapParentNodes->second == itMapChildNodes->second->mParent)) {
                    itMapParentNodes->second->mChildren[p++] = itMapChildNodes->second;
                }
            }
        }
    }

    if (!pScene->mRootNode->mNumChildren)
        throw DeadlyImportError("LWO: Unable to build a valid node graph");

    // Remove a single root node with no meshes assigned to it ...
    if (1 == pScene->mRootNode->mNumChildren)   {
        aiNode* pc = pScene->mRootNode->mChildren[0];
        pc->mParent = pScene->mRootNode->mChildren[0] = NULL;
        delete pScene->mRootNode;
        pScene->mRootNode = pc;
    }

    // convert the whole stuff to RH with CCW winding
    MakeLeftHandedProcess maker;
    maker.Execute(pScene);

    FlipWindingOrderProcess flipper;
    flipper.Execute(pScene);
}